

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O3

long go(void)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  Section *in_RDX;
  ImageSize *in_RSI;
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  *in_RDI;
  Gradient *in_R8;
  int in_R9D;
  vector<double,_std::allocator<double>_> durations;
  vector<PixelColor,_std::allocator<PixelColor>_> image_data;
  vector<CalculationResult,_std::allocator<CalculationResult>_> results_per_point;
  vector<int,_std::allocator<int>_> iterations_histogram;
  vector<double,_std::allocator<double>_> local_b8;
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  *local_98;
  Section *local_90;
  Gradient *local_88;
  double local_80;
  vector<PixelColor,_std::allocator<PixelColor>_> local_78;
  vector<CalculationResult,_std::allocator<CalculationResult>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_90 = in_RDX;
  local_88 = in_R8;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)(in_ECX + 1),(allocator_type *)&local_60);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::vector
            (&local_60,(long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_78);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::vector
            (&local_78,(long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_b8);
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_98 = in_RDI;
  if (0 < in_R9D) {
    do {
      lVar1 = std::chrono::_V2::system_clock::now();
      mandelbrot_calc(in_RSI,local_90,in_ECX,&local_48,&local_60);
      mandelbrot_colorize(in_ECX,local_88,&local_78,&local_48,&local_60);
      lVar2 = std::chrono::_V2::system_clock::now();
      local_80 = (double)(lVar2 - lVar1) / 1000000000.0;
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_80;
        local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      in_R9D = in_R9D + -1;
    } while (in_R9D != 0);
  }
  std::
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<PixelColor,std::allocator<PixelColor>>&,std::vector<double,std::allocator<double>>&,void>
            (local_98,&local_78,&local_b8);
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)local_98;
}

Assistant:

auto go(const ImageSize& image, const Section& section, const int max_iterations, const Gradient& gradient, const int repetitions) noexcept
{
    // iterations_histogram: for simplicity we only use indices [1] .. [max_iterations], [0] is unused
    std::vector<int> iterations_histogram(static_cast<std::size_t>(max_iterations + 1));

    // For every point store a tuple consisting of the final iteration and (for escaped points)
    // the distance to the next iteration (as value of 0.0 .. 1.0).
    std::vector<CalculationResult> results_per_point(static_cast<std::size_t>(image.width * image.height));

    std::vector<PixelColor> image_data(static_cast<std::size_t>(image.width * image.height));
    std::vector<double> durations;

    for (int i = 0; i < repetitions; ++i) {
        const auto t1 = std::chrono::high_resolution_clock::now();
        mandelbrot_calc(image, section, max_iterations, iterations_histogram, results_per_point);
        mandelbrot_colorize(max_iterations, gradient, image_data, iterations_histogram, results_per_point);
        const auto t2 = std::chrono::high_resolution_clock::now();

        durations.push_back(std::chrono::duration<double>{t2 - t1}.count());
    }

    return std::make_tuple(image_data, durations);
}